

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

Dimensions ftxui::Terminal::Size(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  winsize w;
  
  w.ws_row = 0;
  w.ws_col = 0;
  w.ws_xpixel = 0;
  w.ws_ypixel = 0;
  iVar1 = ioctl(1,0x5413,&w);
  uVar3 = (ulong)w.ws_col;
  if (iVar1 < 0 || (w.ws_row == 0 || w.ws_col == 0)) {
    uVar3 = (ulong)(anonymous_namespace)::FallbackSize()::g_fallback_size;
  }
  uVar2 = (ulong)DAT_0011f204;
  if (iVar1 >= 0 && (w.ws_row != 0 && w.ws_col != 0)) {
    uVar2 = (ulong)w & 0xffff;
  }
  return (Dimensions)(uVar3 | uVar2 << 0x20);
}

Assistant:

Dimensions Size() {
#if defined(__EMSCRIPTEN__)
  // This dimension was chosen arbitrarily to be able to display:
  // https://arthursonzogni.com/FTXUI/examples
  // This will have to be improved when someone has time to implement and need
  // it.
  return FallbackSize();
#elif defined(_WIN32)
  CONSOLE_SCREEN_BUFFER_INFO csbi;

  if (GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &csbi)) {
    return Dimensions{csbi.srWindow.Right - csbi.srWindow.Left + 1,
                      csbi.srWindow.Bottom - csbi.srWindow.Top + 1};
  }

  return FallbackSize();
#else
  winsize w{};
  const int status = ioctl(STDOUT_FILENO, TIOCGWINSZ, &w);  // NOLINT
  // The ioctl return value result should be checked. Some operating systems
  // don't support TIOCGWINSZ.
  if (w.ws_col == 0 || w.ws_row == 0 || status < 0) {
    return FallbackSize();
  }
  return Dimensions{w.ws_col, w.ws_row};
#endif
}